

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O2

int vkt::tessellation::anon_unknown_0::intPow(int base,int exp)

{
  int iVar1;
  int iVar2;
  
  if (base != 0) {
    iVar1 = intPow((uint)base >> 1,exp);
    iVar2 = iVar1 * iVar1 * 3;
    if ((base & 1U) == 0) {
      iVar2 = iVar1 * iVar1;
    }
    return iVar2;
  }
  return 1;
}

Assistant:

int intPow (int base, int exp)
{
	DE_ASSERT(exp >= 0);
	if (exp == 0)
		return 1;
	else
	{
		const int sub = intPow(base, exp/2);
		if (exp % 2 == 0)
			return sub*sub;
		else
			return sub*sub*base;
	}
}